

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::MakeCurrentPerfCase::Spec::toName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  SurfaceType SVar1;
  ostream *poVar2;
  bool *pbVar3;
  ostringstream name;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,"context");
  if (1 < this->contextCount) {
    poVar2 = std::operator<<(&local_190,"s_");
    std::ostream::operator<<(poVar2,this->contextCount);
  }
  SVar1 = this->surfaceTypes;
  if ((SVar1 & SURFACETYPE_WINDOW) != 0) {
    poVar2 = std::operator<<(&local_190,"_window");
    pbVar3 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar3 = (bool *)0x187282b;
    }
    std::operator<<(poVar2,pbVar3);
    SVar1 = this->surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PIXMAP) != 0) {
    poVar2 = std::operator<<(&local_190,"_pixmap");
    pbVar3 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar3 = (bool *)0x187282b;
    }
    std::operator<<(poVar2,pbVar3);
    SVar1 = this->surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PBUFFER) != 0) {
    poVar2 = std::operator<<(&local_190,"_pbuffer");
    pbVar3 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar3 = (bool *)0x187282b;
    }
    std::operator<<(poVar2,pbVar3);
  }
  if (1 < this->surfaceCount) {
    poVar2 = std::operator<<(&local_190,"_");
    std::ostream::operator<<(poVar2,this->surfaceCount);
  }
  if (this->release == true) {
    std::operator<<(&local_190,"_release");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string MakeCurrentPerfCase::Spec::toName (void) const
{
	ostringstream name;

	name << "context";

	if (contextCount > 1)
		name << "s_" << contextCount;

	if ((surfaceTypes & SURFACETYPE_WINDOW) != 0)
		name << "_window" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		name << "_pixmap" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		name << "_pbuffer" << (surfaceCount > 1 ? "s" : "");

	if (surfaceCount > 1)
		name << "_" << surfaceCount;

	if (release)
		name << "_release";

	return name.str();
}